

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::TypedExpectation<void_(int_*,_unsigned_long)>::Matches
          (TypedExpectation<void_(int_*,_unsigned_long)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tr1::tuple<testing::Matcher<int*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<int*,unsigned_long,void,void,void,void,void,void,void,void>>
                    (&this->matchers_,args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tr1::tuple<int_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
            ::Matches(&(this->extra_matcher_).
                       super_MatcherBase<const_std::tr1::tuple<int_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
                      ,args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }